

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void __thiscall CConsole::~CConsole(CConsole *this)

{
  ~CConsole(this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

CConsole::~CConsole()
{
	CCommand *pCommand = m_pFirstCommand;
	while(pCommand)
	{
		CCommand *pNext = pCommand->m_pNext;

		FCommandCallback pfnCallback = pCommand->m_pfnCallback;
		void *pUserData = pCommand->m_pUserData;
		while(pfnCallback == Con_Chain)
		{
			CChain *pChainInfo = static_cast<CChain *>(pUserData);
			pfnCallback = pChainInfo->m_pfnCallback;
			pUserData = pChainInfo->m_pCallbackUserData;
			mem_free(pChainInfo);
		}

		mem_free(pCommand);

		pCommand = pNext;
	}
	if(m_pTempMapListHeap)
	{
		delete m_pTempMapListHeap;
		m_pTempMapListHeap = 0;
	}
}